

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::ArgumentParser::ArgumentParser(ArgumentParser *this,string *description_,string *epilog_)

{
  allocator local_7c;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  function<bool_(const_args::Group_&)> local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *epilog__local;
  string *description__local;
  ArgumentParser *this_local;
  
  local_20 = epilog_;
  epilog__local = description_;
  description__local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            ((function<bool(args::Group_const&)> *)&local_78,Group::Validators::AllChildGroups);
  Group::Group(&this->super_Group,&local_40,&local_78);
  std::function<bool_(const_args::Group_&)>::~function(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__ArgumentParser_0016b878;
  std::__cxx11::string::string((string *)&this->prog);
  std::__cxx11::string::string((string *)&this->proglinePostfix);
  std::__cxx11::string::string((string *)&this->description,(string *)epilog__local);
  std::__cxx11::string::string((string *)&this->epilog,(string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->longprefix,"--",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->shortprefix,"-",&local_7a);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->longseparator,"=",&local_7b);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->terminator,"--",&local_7c);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c);
  this->allowJoinedShortValue = true;
  this->allowJoinedLongValue = true;
  this->allowSeparateShortValue = true;
  this->allowSeparateLongValue = true;
  HelpParams::HelpParams(&this->helpParams);
  return;
}

Assistant:

ArgumentParser(const std::string &description_, const std::string &epilog_ = std::string()) :
                Group("", Group::Validators::AllChildGroups),
                description(description_),
                epilog(epilog_),
                longprefix("--"),
                shortprefix("-"),
                longseparator("="),
                terminator("--"),
                allowJoinedShortValue(true),
                allowJoinedLongValue(true),
                allowSeparateShortValue(true),
                allowSeparateLongValue(true) {}